

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_augment(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_augment **augments)

{
  lysp_ext_instance **exts;
  lysp_node **siblings;
  lysp_node_augment *plVar1;
  lyd_node *plVar2;
  size_t len;
  LY_ERR LVar3;
  lysp_node_augment *parent_00;
  lysp_node_augment *plVar4;
  char *pcVar5;
  char **ppcVar6;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar7;
  lysp_ext_instance **exts_00;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff70;
  ly_stmt in_stack_ffffffffffffff74;
  char *local_80;
  size_t local_78;
  lysp_node_action **local_70;
  lysp_node_notif **local_68;
  char **local_60;
  lysp_qname **local_58;
  char **local_50;
  uint16_t *local_48;
  lysp_when **local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node_augment *)calloc(1,0x60);
  if (parent_00 == (lysp_node_augment *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_augment");
  }
  else {
    plVar1 = *augments;
    if (*augments != (lysp_node_augment *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = (lysp_node_augment *)(plVar4->field_0).node.next;
      } while (plVar1 != (lysp_node_augment *)0x0);
      augments = &(plVar4->field_0).field_1.next;
    }
    *augments = parent_00;
    exts_00 = &local_38;
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_80,(char **)exts_00,&local_78);
    len = local_78;
    if (LVar3 == LY_SUCCESS) {
      if (local_78 == 0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        exts_00 = (lysp_ext_instance **)0x1d17bc;
        ly_log(plVar7,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.");
      }
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = local_80;
        if (len == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,len,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,local_80,&(parent_00->field_0).node.name);
      }
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x8000;
        (parent_00->field_0).node.parent = parent;
        LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_80,&local_78);
        if ((LVar3 == LY_SUCCESS) &&
           (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_SEMICOLON)) {
          if (in_stack_ffffffffffffff74 == LY_STMT_SYNTAX_LEFT_BRACE) {
            LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_80,&local_78);
            if ((LVar3 == LY_SUCCESS) &&
               (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
              exts = &(parent_00->field_0).node.exts;
              local_68 = &parent_00->notifs;
              local_70 = &parent_00->actions;
              siblings = &parent_00->child;
              local_40 = &parent_00->when;
              local_48 = &(parent_00->field_0).node.flags;
              local_50 = &(parent_00->field_0).node.ref;
              local_58 = &(parent_00->field_0).node.iffeatures;
              local_60 = &(parent_00->field_0).node.dsc;
              do {
                if ((int)in_stack_ffffffffffffff74 < 0x2000) {
                  if ((int)in_stack_ffffffffffffff74 < 0x100) {
                    if ((int)in_stack_ffffffffffffff74 < 0x20) {
                      if (in_stack_ffffffffffffff74 == LY_STMT_NOTIFICATION) {
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar5 = "notification";
LAB_001783a2:
                          format = 
                          "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                          ;
                          goto LAB_001783d6;
                        }
                        LVar3 = parse_notif(ctx,(lysp_node *)parent_00,local_68);
                      }
                      else {
                        if (in_stack_ffffffffffffff74 != LY_STMT_ACTION) goto LAB_00178344;
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar5 = "action";
                          goto LAB_001783a2;
                        }
                        LVar3 = parse_action(ctx,(lysp_node *)parent_00,local_70);
                      }
                    }
                    else {
                      if (in_stack_ffffffffffffff74 == LY_STMT_ANYDATA) {
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar5 = "anydata";
                          goto LAB_001783a2;
                        }
                      }
                      else if (in_stack_ffffffffffffff74 != LY_STMT_ANYXML) goto LAB_00178344;
                      LVar3 = parse_any(ctx,in_stack_ffffffffffffff74,(lysp_node *)parent_00,
                                        siblings);
                    }
                  }
                  else if ((int)in_stack_ffffffffffffff74 < 0x400) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_CASE) {
                      LVar3 = parse_case(ctx,(lysp_node *)parent_00,siblings);
                    }
                    else {
                      if (in_stack_ffffffffffffff74 != LY_STMT_CHOICE) goto LAB_00178344;
                      LVar3 = parse_choice(ctx,(lysp_node *)parent_00,siblings);
                    }
                  }
                  else if (in_stack_ffffffffffffff74 == LY_STMT_CONTAINER) {
                    LVar3 = parse_container(ctx,(lysp_node *)parent_00,siblings);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_LEAF) goto LAB_00178344;
                    LVar3 = parse_leaf(ctx,(lysp_node *)parent_00,siblings);
                  }
                }
                else if ((int)in_stack_ffffffffffffff74 < 0xf0000) {
                  if ((int)in_stack_ffffffffffffff74 < 0x8000) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_LEAF_LIST) {
                      LVar3 = parse_leaflist(ctx,(lysp_node *)parent_00,siblings);
                    }
                    else {
                      if (in_stack_ffffffffffffff74 != LY_STMT_LIST) goto LAB_00178344;
                      LVar3 = parse_list(ctx,(lysp_node *)parent_00,siblings);
                    }
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_USES) {
                      if (in_stack_ffffffffffffff74 == LY_STMT_DESCRIPTION) {
                        pcVar5 = *local_60;
                        parent_stmt = LY_STMT_DESCRIPTION;
                        ppcVar6 = local_60;
                        goto LAB_0017822a;
                      }
LAB_00178344:
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar7 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar7 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar5 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
                      format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_001783d6:
                      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"augment");
                      goto LAB_00178339;
                    }
                    LVar3 = parse_uses(ctx,(lysp_node *)parent_00,siblings);
                  }
                }
                else if ((int)in_stack_ffffffffffffff74 < 0x270000) {
                  if (in_stack_ffffffffffffff74 == LY_STMT_EXTENSION_INSTANCE) {
                    exts_00 = (lysp_ext_instance **)0x80;
                    LVar3 = parse_ext(ctx,local_80,local_78,parent_00,LY_STMT_AUGMENT,0,exts);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_IF_FEATURE) goto LAB_00178344;
                    LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_58,(yang_arg)exts,exts_00);
                  }
                }
                else if (in_stack_ffffffffffffff74 == LY_STMT_REFERENCE) {
                  pcVar5 = *local_50;
                  parent_stmt = LY_STMT_REFERENCE;
                  ppcVar6 = local_50;
LAB_0017822a:
                  exts_00 = (lysp_ext_instance **)0x2;
                  LVar3 = parse_text_field(ctx,pcVar5,parent_stmt,(uint32_t)ppcVar6,(char **)0x2,
                                           Y_IDENTIF_ARG,(uint16_t *)exts,
                                           (lysp_ext_instance **)
                                           CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70));
                }
                else if (in_stack_ffffffffffffff74 == LY_STMT_STATUS) {
                  LVar3 = parse_status(ctx,local_48,exts);
                }
                else {
                  if (in_stack_ffffffffffffff74 != LY_STMT_WHEN) goto LAB_00178344;
                  LVar3 = parse_when(ctx,local_40);
                }
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_80,&local_78);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
              } while (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE);
              if ((*exts == (lysp_ext_instance *)0x0) ||
                 (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
                 LVar3 == LY_SUCCESS)) {
                LVar3 = LY_SUCCESS;
              }
            }
          }
          else {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar5 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
LAB_00178339:
            LVar3 = LY_EVALID;
          }
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_augment(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_augment **augments)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_augment *aug;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), augments, aug, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));
    CHECK_NONEMPTY(ctx, word_len, "augment");
    INSERT_WORD_GOTO(ctx, buf, aug->nodeid, word, word_len, ret, cleanup);
    aug->nodetype = LYS_AUGMENT;
    aug->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, aug->dsc, LY_STMT_DESCRIPTION, 0, &aug->dsc, Y_STR_ARG, NULL, &aug->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &aug->iffeatures, Y_STR_ARG, &aug->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, aug->ref, LY_STMT_REFERENCE, 0, &aug->ref, Y_STR_ARG, NULL, &aug->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &aug->flags, &aug->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &aug->when));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "augment");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(parse_case(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)aug, &aug->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)aug, &aug->child));
            break;

        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "augment");
            LY_CHECK_RET(parse_action(ctx, (struct lysp_node *)aug, &aug->actions));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "augment");
            LY_CHECK_RET(parse_notif(ctx, (struct lysp_node *)aug, &aug->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, aug, LY_STMT_AUGMENT, 0, &aug->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "augment");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, aug->exts, ret, cleanup);
    }

cleanup:
    return ret;
}